

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

int abon(void)

{
  schar sVar1;
  schar sVar2;
  int iVar3;
  int dex;
  int str;
  int sbon;
  
  sVar1 = acurr(0);
  sVar2 = acurr(3);
  iVar3 = (int)sVar2;
  if (u.umonnum == u.umonster) {
    if (sVar1 < '\x06') {
      dex = -2;
    }
    else if (sVar1 < '\b') {
      dex = -1;
    }
    else if (sVar1 < '\x11') {
      dex = 0;
    }
    else if (sVar1 < 'E') {
      dex = 1;
    }
    else if (sVar1 < 'v') {
      dex = 2;
    }
    else {
      dex = 3;
    }
    str = (uint)(u.ulevel < 3) + dex;
    if (iVar3 < 4) {
      str = str + -3;
    }
    else if (iVar3 < 6) {
      str = str + -2;
    }
    else if (iVar3 < 8) {
      str = str + -1;
    }
    else if (0xd < iVar3) {
      str = str + iVar3 + -0xe;
    }
  }
  else {
    iVar3 = adj_lev(&u.uz,mons + u.umonnum);
    str = iVar3 + -3;
  }
  return str;
}

Assistant:

int abon(void)
{
	int sbon;
	int str = ACURR(A_STR), dex = ACURR(A_DEX);

	if (Upolyd) return adj_lev(&u.uz, &mons[u.umonnum]) - 3;
	if (str < 6) sbon = -2;
	else if (str < 8) sbon = -1;
	else if (str < 17) sbon = 0;
	else if (str <= STR18(50)) sbon = 1;	/* up to 18/50 */
	else if (str < STR18(100)) sbon = 2;
	else sbon = 3;

/* Game tuning kludge: make it a bit easier for a low level character to hit */
	sbon += (u.ulevel < 3) ? 1 : 0;

	if (dex < 4) return sbon-3;
	else if (dex < 6) return sbon-2;
	else if (dex < 8) return sbon-1;
	else if (dex < 14) return sbon;
	else return sbon + dex-14;
}